

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int op_http_conn_read_ahead
              (OpusHTTPStream *_stream,OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  opus_int64 oVar7;
  opus_int64 oVar8;
  int in_R8D;
  opus_int64 oVar9;
  bool bVar10;
  long local_40;
  
  oVar9 = _conn->pos;
  local_40 = _conn->end_pos;
  lVar1 = _conn->next_pos;
  lVar2 = _conn->next_end;
  if (_just_read_ahead == 0) {
    _conn->next_pos = -1;
    uVar5 = 0x8000;
    iVar4 = op_http_conn_send_request(_stream,_conn,_target,0x8000,in_R8D);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  else {
    uVar5 = CONCAT71((int7)((ulong)_target >> 8),_target < local_40 || local_40 < 0);
    oVar7 = _target;
    if (_target < local_40 || local_40 < 0) goto LAB_00108ebd;
  }
  oVar7 = local_40;
  if (-1 < lVar1) {
    for (; oVar9 < local_40; oVar9 = oVar9 + (ulong)uVar3) {
      iVar4 = (_stream->response).cbuf;
      iVar6 = (int)(local_40 - oVar9);
      if ((long)iVar4 <= local_40 - oVar9) {
        iVar6 = iVar4;
      }
      uVar3 = op_http_conn_read(_conn,(_stream->response).buf,iVar6,(int)uVar5);
      if ((int)uVar3 < 1) {
        bVar10 = false;
        goto LAB_00108e81;
      }
    }
    if (_just_read_ahead == 0) {
      oVar7 = _conn->next_end;
      _conn->next_pos = lVar1;
      _conn->next_end = lVar2;
      oVar8 = _target;
      local_40 = lVar2;
    }
    else {
      oVar8 = -1;
      oVar7 = oVar8;
      local_40 = _target;
    }
    iVar4 = op_http_conn_handle_response(_stream,_conn);
    bVar10 = iVar4 == 0;
    if (bVar10) {
      _conn->next_pos = oVar8;
      _conn->next_end = oVar7;
    }
LAB_00108e81:
    oVar7 = local_40;
    if (!bVar10) {
      return -1;
    }
  }
LAB_00108ebd:
  while( true ) {
    if (oVar7 <= oVar9) {
      if (_just_read_ahead == 0) {
        iVar4 = op_http_conn_handle_response(_stream,_conn);
        if (iVar4 != 0) {
          return -1;
        }
      }
      else {
        _conn->pos = oVar7;
      }
      return 0;
    }
    iVar4 = (_stream->response).cbuf;
    iVar6 = (int)(oVar7 - oVar9);
    if ((long)iVar4 <= oVar7 - oVar9) {
      iVar6 = iVar4;
    }
    uVar3 = op_http_conn_read(_conn,(_stream->response).buf,iVar6,(int)uVar5);
    if ((int)uVar3 < 1) break;
    oVar9 = oVar9 + (ulong)uVar3;
  }
  return -1;
}

Assistant:

static int op_http_conn_read_ahead(OpusHTTPStream *_stream,
 OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target){
  opus_int64 pos;
  opus_int64 end_pos;
  opus_int64 next_pos;
  opus_int64 next_end;
  ptrdiff_t  nread;
  int        ret;
  pos=_conn->pos;
  end_pos=_conn->end_pos;
  next_pos=_conn->next_pos;
  next_end=_conn->next_end;
  if(!_just_read_ahead){
    /*We need to issue a new pipelined request.
      This is the only case where we allow more than one outstanding request
       at a time, so we need to reset next_pos (we'll restore it below if we
       did have an outstanding request).*/
    OP_ASSERT(_stream->pipeline);
    _conn->next_pos=-1;
    ret=op_http_conn_send_request(_stream,_conn,_target,
     OP_PIPELINE_CHUNK_SIZE,0);
    if(OP_UNLIKELY(ret<0))return ret;
  }
  /*We can reach the target position by reading forward in the current chunk.*/
  if(_just_read_ahead&&(end_pos<0||_target<end_pos))end_pos=_target;
  else if(next_pos>=0){
    opus_int64 next_next_pos;
    opus_int64 next_next_end;
    /*We already have a request outstanding.
      Finish off the current chunk.*/
    while(pos<end_pos){
      nread=op_http_conn_read(_conn,_stream->response.buf,
       (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
      /*We failed to read ahead.*/
      if(nread<=0)return OP_FALSE;
      pos+=nread;
    }
    OP_ASSERT(pos==end_pos);
    if(_just_read_ahead){
      next_next_pos=next_next_end=-1;
      end_pos=_target;
    }
    else{
      OP_ASSERT(_conn->next_pos==_target);
      next_next_pos=_target;
      next_next_end=_conn->next_end;
      _conn->next_pos=next_pos;
      _conn->next_end=next_end;
      end_pos=next_end;
    }
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
    _conn->next_pos=next_next_pos;
    _conn->next_end=next_next_end;
  }
  while(pos<end_pos){
    nread=op_http_conn_read(_conn,_stream->response.buf,
     (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
    /*We failed to read ahead.*/
    if(nread<=0)return OP_FALSE;
    pos+=nread;
  }
  OP_ASSERT(pos==end_pos);
  if(!_just_read_ahead){
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
  }
  else _conn->pos=end_pos;
  OP_ASSERT(_conn->pos==_target);
  return 0;
}